

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint zlib_compress(uchar **out,size_t *outsize,uchar *in,size_t insize,
                  LodePNGCompressSettings *settings)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_R8;
  uint error;
  LodePNGCompressSettings *unaff_retaddr;
  undefined4 local_4;
  
  if (*(long *)(in_R8 + 0x18) == 0) {
    local_4 = lodepng_zlib_compress
                        ((uchar **)outsize,(size_t *)in,(uchar *)insize,(size_t)settings,
                         unaff_retaddr);
  }
  else {
    iVar1 = (**(code **)(in_R8 + 0x18))(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
    local_4 = 0;
    if (iVar1 != 0) {
      local_4 = 0x6f;
    }
  }
  return local_4;
}

Assistant:

static unsigned zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
                              size_t insize, const LodePNGCompressSettings* settings) {
  if(settings->custom_zlib) {
    unsigned error = settings->custom_zlib(out, outsize, in, insize, settings);
    /*the custom zlib is allowed to have its own error codes, however, we translate it to code 111*/
    return error ? 111 : 0;
  } else {
    return lodepng_zlib_compress(out, outsize, in, insize, settings);
  }
}